

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageEllipse(gdImagePtr im,int mx,int my,int w,int h,int c)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int x;
  int iVar5;
  int x_00;
  undefined4 local_78;
  undefined4 local_74;
  undefined8 local_70;
  undefined8 local_60;
  undefined8 local_58;
  
  iVar5 = w >> 1;
  x = iVar5 + mx;
  gdImageSetPixel(im,x,my,c);
  x_00 = mx - iVar5;
  gdImageSetPixel(im,x_00,my,c);
  if (0 < iVar5) {
    lVar2 = (long)iVar5;
    lVar3 = (long)(h >> 1) * (long)(h >> 1);
    local_70 = lVar3 * lVar2;
    local_60 = local_70 * 2;
    local_58 = 0;
    local_78 = my;
    do {
      lVar4 = local_70;
      if (local_70 < 1) {
LAB_0010e27f:
        iVar5 = iVar5 + -1;
        x_00 = x_00 + 1;
        x = x + -1;
        local_60 = local_60 + lVar3 * -2;
        local_74 = my;
        local_70 = lVar4 + local_60;
      }
      else {
        local_78 = local_78 + 1;
        my = my + -1;
        local_58 = local_58 + lVar2 * lVar2 * 2;
        lVar4 = local_70 - local_58;
        bVar1 = local_70 < local_58;
        local_74 = my;
        local_70 = lVar4;
        if (lVar4 == 0 || bVar1) goto LAB_0010e27f;
      }
      gdImageSetPixel(im,x_00,local_78,c);
      gdImageSetPixel(im,x_00,local_74,c);
      gdImageSetPixel(im,x,local_78,c);
      gdImageSetPixel(im,x,local_74,c);
      my = local_74;
    } while (0 < iVar5);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageEllipse(gdImagePtr im, int mx, int my, int w, int h, int c)
{
	int x=0,mx1=0,mx2=0,my1=0,my2=0;
	long aq,bq,dx,dy,r,rx,ry,a,b;

	a=w>>1;
	b=h>>1;
	gdImageSetPixel(im,mx+a, my, c);
	gdImageSetPixel(im,mx-a, my, c);
	mx1 = mx-a;
	my1 = my;
	mx2 = mx+a;
	my2 = my;

	aq = a * a;
	bq = b * b;
	dx = aq << 1;
	dy = bq << 1;
	r  = a * bq;
	rx = r << 1;
	ry = 0;
	x = a;
	while (x > 0) {
		if (r > 0) {
			my1++;
			my2--;
			ry +=dx;
			r  -=ry;
		}
		if (r <= 0) {
			x--;
			mx1++;
			mx2--;
			rx -=dy;
			r  +=rx;
		}
		gdImageSetPixel(im,mx1, my1, c);
		gdImageSetPixel(im,mx1, my2, c);
		gdImageSetPixel(im,mx2, my1, c);
		gdImageSetPixel(im,mx2, my2, c);
	}
}